

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv_shutdown(uv_shutdown_t *req,uv_stream_t *stream,uv_shutdown_cb cb)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  
  if ((stream->type != UV_NAMED_PIPE) && (stream->type != UV_TCP)) {
    __assert_fail("(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE) && \"uv_shutdown (unix) only supports uv_handle_t right now\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4e5,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
  }
  uVar1 = stream->flags;
  iVar3 = -0x6b;
  if ((uVar1 & 0x5b) == 0x40) {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x4ee,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
    }
    req->type = UV_SHUTDOWN;
    req->active_queue[0] = stream->loop->active_reqs;
    plVar2 = (long *)stream->loop->active_reqs[1];
    req->active_queue[1] = plVar2;
    *plVar2 = (long)req->active_queue;
    stream->loop->active_reqs[1] = req->active_queue;
    req->handle = stream;
    req->cb = cb;
    stream->shutdown_req = req;
    stream->flags = uVar1 | 8;
    uv__io_start(stream->loop,&stream->io_watcher,4);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int uv_shutdown(uv_shutdown_t* req, uv_stream_t* stream, uv_shutdown_cb cb) {
  assert((stream->type == UV_TCP || stream->type == UV_NAMED_PIPE) &&
         "uv_shutdown (unix) only supports uv_handle_t right now");

  if (!(stream->flags & UV_STREAM_WRITABLE) ||
      stream->flags & UV_STREAM_SHUT ||
      stream->flags & UV_STREAM_SHUTTING ||
      uv__is_closing(stream)) {
    return -ENOTCONN;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Initialize request */
  uv__req_init(stream->loop, req, UV_SHUTDOWN);
  req->handle = stream;
  req->cb = cb;
  stream->shutdown_req = req;
  stream->flags |= UV_STREAM_SHUTTING;

  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}